

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

int cm_zlib_gzeof(gzFile file)

{
  int local_24;
  gz_statep state;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = 0;
  }
  else if ((file[1].have == 0x1c4f) || (file[1].have == 0x79b1)) {
    if (file[1].have == 0x1c4f) {
      local_24 = *(int *)((long)&file[3].next + 4);
    }
    else {
      local_24 = 0;
    }
    file_local._4_4_ = local_24;
  }
  else {
    file_local._4_4_ = 0;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzeof(gzFile file) {
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return 0;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return 0;

    /* return end-of-file state */
    return state->mode == GZ_READ ? state->past : 0;
}